

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator * __thiscall
QMultiHash<int,QString>::emplace<QString_const&>
          (QMultiHash<int,_QString> *this,int *key,QString *args)

{
  bool bVar1;
  QString *in_RDX;
  undefined8 *in_RSI;
  iterator *in_RDI;
  long in_FS_OFFSET;
  QMultiHash<int,_QString> copy;
  QMultiHash<int,_QString> *in_stack_ffffffffffffff68;
  QMultiHash<int,_QString> *in_stack_ffffffffffffff70;
  QString *in_stack_ffffffffffffff78;
  int *in_stack_ffffffffffffff80;
  int *key_00;
  iterator *this_00;
  int local_20 [6];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar1 = QMultiHash<int,_QString>::isDetached(in_stack_ffffffffffffff70);
  if (bVar1) {
    bVar1 = QHashPrivate::Data<QHashPrivate::MultiNode<int,_QString>_>::shouldGrow
                      ((Data<QHashPrivate::MultiNode<int,_QString>_> *)*in_RSI);
    if (bVar1) {
      key_00 = local_20;
      QString::QString((QString *)in_stack_ffffffffffffff70,(QString *)in_stack_ffffffffffffff68);
      QMultiHash<int,_QString>::emplace_helper<QString>
                ((QMultiHash<int,_QString> *)this_00,key_00,in_RDX);
      QString::~QString((QString *)0x788293);
    }
    else {
      emplace_helper<QString_const&>
                ((QMultiHash<int,_QString> *)this_00,in_stack_ffffffffffffff80,
                 in_stack_ffffffffffffff78);
    }
  }
  else {
    QMultiHash<int,_QString>::QMultiHash(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    QMultiHash<int,_QString>::detach(in_stack_ffffffffffffff70);
    emplace_helper<QString_const&>
              ((QMultiHash<int,_QString> *)this_00,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff78);
    QMultiHash<int,_QString>::~QMultiHash(in_stack_ffffffffffffff70);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }